

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

void hmac_key(ssh2_mac *mac,ptrlen key)

{
  strbuf *buf_o;
  uchar *puVar1;
  size_t i;
  char *pcVar2;
  char *pcVar3;
  size_t i_3;
  char *pcVar4;
  
  pcVar4 = (char *)key.len;
  puVar1 = (uchar *)key.ptr;
  if ((mac[-3].vt)->name < pcVar4) {
    buf_o = strbuf_new_nm();
    strbuf_append(buf_o,(size_t)(mac[-3].vt)->text_name);
    hash_simple((ssh_hashalg *)mac[-3].vt,key,buf_o->u);
    puVar1 = buf_o->u;
    pcVar4 = (char *)buf_o->len;
  }
  else {
    buf_o = (strbuf *)0x0;
  }
  (**(code **)((mac[-3].binarysink_)->write + 8))();
  for (pcVar2 = (char *)0x0; pcVar3 = pcVar4, pcVar4 != pcVar2; pcVar2 = pcVar2 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-3].binarysink_)->writefmtv,puVar1[(long)pcVar2] ^ 0x5c);
  }
  for (; pcVar3 < (mac[-3].vt)->name; pcVar3 = pcVar3 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-3].binarysink_)->writefmtv,'\\');
  }
  (**(code **)((mac[-2].vt)->new + 8))();
  for (pcVar2 = (char *)0x0; pcVar4 != pcVar2; pcVar2 = pcVar2 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-2].vt)->free,puVar1[(long)pcVar2] ^ 0x36);
  }
  for (; pcVar4 < (mac[-3].vt)->name; pcVar4 = pcVar4 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-2].vt)->free,'6');
  }
  if (buf_o == (strbuf *)0x0) {
    return;
  }
  strbuf_free(buf_o);
  return;
}

Assistant:

static void hmac_key(ssh2_mac *mac, ptrlen key)
{
    struct hmac *ctx = container_of(mac, struct hmac, mac);

    const uint8_t *kp;
    size_t klen;
    strbuf *sb = NULL;

    if (key.len > ctx->hashalg->blocklen) {
        /*
         * RFC 2104 section 2: if the key exceeds the block length of
         * the underlying hash, then we start by hashing the key, and
         * use that hash as the 'true' key for the HMAC construction.
         */
        sb = strbuf_new_nm();
        strbuf_append(sb, ctx->hashalg->hlen);
        hash_simple(ctx->hashalg, key, sb->u);
        kp = sb->u;
        klen = sb->len;
    } else {
        /*
         * A short enough key is used as is.
         */
        kp = (const uint8_t *)key.ptr;
        klen = key.len;
    }

    ssh_hash_reset(ctx->h_outer);
    for (size_t i = 0; i < klen; i++)
        put_byte(ctx->h_outer, PAD_OUTER ^ kp[i]);
    for (size_t i = klen; i < ctx->hashalg->blocklen; i++)
        put_byte(ctx->h_outer, PAD_OUTER);

    ssh_hash_reset(ctx->h_inner);
    for (size_t i = 0; i < klen; i++)
        put_byte(ctx->h_inner, PAD_INNER ^ kp[i]);
    for (size_t i = klen; i < ctx->hashalg->blocklen; i++)
        put_byte(ctx->h_inner, PAD_INNER);

    if (sb)
        strbuf_free(sb);
}